

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<std::complex<double>_>::Write(TPZEqnArray<std::complex<double>_> *this,FILE *outputfile)

{
  int64_t iVar1;
  ostream *poVar2;
  void *pvVar3;
  int *piVar4;
  complex<double> *__ptr;
  FILE *in_RSI;
  long in_RDI;
  int aux;
  int local_14;
  FILE *local_10;
  
  local_10 = in_RSI;
  fwrite((void *)(in_RDI + 4),4,1,in_RSI);
  fwrite((void *)(in_RDI + 0x51c8),4,1,local_10);
  iVar1 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 8));
  local_14 = (int)iVar1;
  if (local_14 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "void TPZEqnArray<std::complex<double>>::Write(FILE *) [TVar = std::complex<double>]"
                            );
    pvVar3 = (void *)std::ostream::operator<<(poVar2,0xc9);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  fwrite(&local_14,4,1,local_10);
  piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 8),0);
  fwrite(piVar4,4,(long)local_14,local_10);
  iVar1 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x1b8));
  local_14 = (int)iVar1;
  if (local_14 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "void TPZEqnArray<std::complex<double>>::Write(FILE *) [TVar = std::complex<double>]"
                            );
    pvVar3 = (void *)std::ostream::operator<<(poVar2,0xd2);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  fwrite(&local_14,4,1,local_10);
  piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x1b8),0);
  fwrite(piVar4,4,(long)local_14,local_10);
  iVar1 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x4208));
  local_14 = (int)iVar1;
  fwrite(&local_14,4,1,local_10);
  piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x4208),0);
  fwrite(piVar4,4,(long)local_14,local_10);
  iVar1 = TPZVec<std::complex<double>_>::NElements
                    ((TPZVec<std::complex<double>_> *)(in_RDI + 0x368));
  local_14 = (int)iVar1;
  fwrite(&local_14,4,1,local_10);
  __ptr = TPZVec<std::complex<double>_>::operator[]
                    ((TPZVec<std::complex<double>_> *)(in_RDI + 0x368),0);
  fwrite(__ptr,8,(long)local_14,local_10);
  return;
}

Assistant:

void TPZEqnArray<TVar>::Write(FILE * outputfile){
	/** Number of equations */
	fwrite(&fNumEq,sizeof(int),1,outputfile);
	//cout << ftell(outputfile) << endl;
	/** Last term added*/
	fwrite(&fLastTerm,sizeof(int),1,outputfile);
	//cout << ftell(outputfile) << endl;
	/** TPZStack fEqStart data */
	int aux = fEqStart.NElements();
	if(aux == 0) 
	{
		std::cout << __PRETTY_FUNCTION__ << __LINE__ << std::endl;
	}
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fEqStart[0],sizeof(int), aux ,outputfile);
	
	/** TPZStack fEqNumber data */
	aux = fEqNumber.NElements();
	if(aux == 0) 
	{
		std::cout << __PRETTY_FUNCTION__ << __LINE__ << std::endl;
	}
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fEqNumber[0],sizeof(int), aux ,outputfile);
	
	/** TPZStack fIndex data */
	aux = fIndex.NElements();
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fIndex[0],sizeof(int), aux ,outputfile);
	
	/** TPZStack fEqValues data */
	aux = fEqValues.NElements();
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fEqValues[0],sizeof(REAL), aux ,outputfile);
}